

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-parser.cc
# Opt level: O0

void __thiscall GenParser::visit(GenParser *this,Symbol *sym)

{
  Name *pNVar1;
  Temp *target;
  BasicBlock *iffalse_00;
  IRBuilder *this_00;
  double __x;
  BasicBlock *iffalse;
  Temp *local_60;
  Temp *temp;
  allocator<char> local_41;
  string local_40 [32];
  BasicBlock *local_20;
  BasicBlock *iftrue;
  Symbol *sym_local;
  GenParser *this_local;
  
  iftrue = (BasicBlock *)sym;
  sym_local = (Symbol *)this;
  if ((sym->isTerminal & 1U) == 0) {
    std::__cxx11::string::string((string *)&iffalse);
    target = IR::IRBuilder::newTemp(&this->super_IRBuilder,(string *)&iffalse);
    std::__cxx11::string::~string((string *)&iffalse);
    local_60 = target;
    IR::IRBuilder::save(&this->super_IRBuilder,target);
    iffalse_00 = IR::IRBuilder::newBasicBlock(&this->super_IRBuilder);
    pNVar1 = IR::IRBuilder::getName(&this->super_IRBuilder,(Symbol *)iftrue);
    IR::IRBuilder::cjump
              (&this->super_IRBuilder,&pNVar1->super_Expr,(this->super_CodeGenerator).code.iftrue,
               iffalse_00);
    IR::IRBuilder::place(&this->super_IRBuilder,iffalse_00);
    IR::IRBuilder::restore(&this->super_IRBuilder,local_60);
    IR::IRBuilder::jump(&this->super_IRBuilder,(this->super_CodeGenerator).code.iffalse);
  }
  else {
    this_00 = &this->super_IRBuilder;
    local_20 = IR::IRBuilder::newBasicBlock(this_00);
    pNVar1 = IR::IRBuilder::getName(this_00,(Symbol *)iftrue);
    IR::IRBuilder::cjump
              (this_00,&pNVar1->super_Expr,local_20,(this->super_CodeGenerator).code.iffalse);
    IR::IRBuilder::place(this_00,local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_40,"yyconsume()",&local_41);
    IR::IRBuilder::exp(this_00,__x);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    IR::IRBuilder::jump(&this->super_IRBuilder,(this->super_CodeGenerator).code.iftrue);
  }
  return;
}

Assistant:

void GenParser::visit(ast::Symbol* sym) {
  if (sym->isTerminal) {
    auto iftrue = newBasicBlock();

    cjump(getName(sym), iftrue, code.iffalse);
    place(iftrue);
    exp("yyconsume()");
    jump(code.iftrue);
    return;
  }

  auto temp = newTemp();
  save(temp);

  auto iffalse = newBasicBlock();

  cjump(getName(sym), code.iftrue, iffalse);

  place(iffalse);
  restore(temp);
  jump(code.iffalse);
}